

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_clone.c
# Opt level: O0

void * clone_new(t_symbol *s,int argc,t_atom *argv)

{
  int iVar1;
  int oldstate;
  int iVar2;
  t_atom *ptVar3;
  _glist *p_Var4;
  t_copy *ptVar5;
  t_in *ptVar6;
  t_out **pptVar7;
  t_out *ptVar8;
  _outlet *p_Var9;
  t_symbol *s_00;
  bool bVar10;
  t_float tVar11;
  t_out *outvec;
  int voicetovis;
  int i;
  int dspstate;
  int wantn;
  _glist *c;
  t_clone *x;
  t_atom *argv_local;
  int argc_local;
  t_symbol *s_local;
  
  s_local = (t_symbol *)pd_new(clone_class);
  iVar1 = clone_voicetovis;
  ((t_clone *)s_local)->x_invec = (t_in *)0x0;
  ((t_clone *)s_local)->x_outvec = (t_out **)0x0;
  ((t_clone *)s_local)->x_startvoice = 0;
  ((t_clone *)s_local)->x_suppressvoice = 0;
  clone_voicetovis = -1;
  if (argc == 0) {
    ((t_clone *)s_local)->x_vec = (t_copy *)0x0;
    ((t_clone *)s_local)->x_n = 0;
  }
  else {
    oldstate = canvas_suspend_dsp();
    x = (t_clone *)argv;
    argv_local._4_4_ = argc;
    while( true ) {
      bVar10 = false;
      if ((0 < argv_local._4_4_) && (bVar10 = false, *(int *)&(x->x_obj).te_g.g_pd == 2)) {
        bVar10 = *(char *)&((x->x_obj).te_g.g_next)->g_pd->c_name == '-';
      }
      if (!bVar10) break;
      iVar2 = strcmp((char *)((x->x_obj).te_g.g_next)->g_pd,"-s");
      if (((iVar2 == 0) && (1 < argv_local._4_4_)) && (*(int *)&(x->x_obj).te_binbuf == 1)) {
        ((t_clone *)s_local)->x_startvoice = (int)*(float *)&(x->x_obj).te_outlet;
        argv_local._4_4_ = argv_local._4_4_ + -2;
        x = (t_clone *)&(x->x_obj).te_inlet;
      }
      else {
        iVar2 = strcmp((char *)((x->x_obj).te_g.g_next)->g_pd,"-x");
        if (iVar2 != 0) goto LAB_00155ef1;
        ((t_clone *)s_local)->x_suppressvoice = 1;
        argv_local._4_4_ = argv_local._4_4_ + -1;
        x = (t_clone *)&(x->x_obj).te_binbuf;
      }
    }
    if (1 < argv_local._4_4_) {
      tVar11 = atom_getfloatarg(0,argv_local._4_4_,(t_atom *)x);
      i = (int)tVar11;
      if ((i < 0) || (*(int *)&(x->x_obj).te_binbuf != 2)) goto LAB_00155af4;
      ((t_clone *)s_local)->x_s = (t_symbol *)(x->x_obj).te_outlet;
LAB_00155b39:
      ((t_clone *)s_local)->x_argc = argv_local._4_4_ + -1;
      ptVar3 = (t_atom *)getbytes((long)((t_clone *)s_local)->x_argc << 4);
      ((t_clone *)s_local)->x_argv = ptVar3;
      memcpy(((t_clone *)s_local)->x_argv,&(x->x_obj).te_binbuf,
             (long)((t_clone *)s_local)->x_argc << 4);
      ((t_clone *)s_local)->x_argv->a_type = A_FLOAT;
      (((t_clone *)s_local)->x_argv->a_w).w_float = (float)((t_clone *)s_local)->x_startvoice;
      p_Var4 = clone_makeone(((t_clone *)s_local)->x_s,
                             ((t_clone *)s_local)->x_argc - ((t_clone *)s_local)->x_suppressvoice,
                             ((t_clone *)s_local)->x_argv + ((t_clone *)s_local)->x_suppressvoice);
      if (p_Var4 != (_glist *)0x0) {
        ptVar5 = (t_copy *)getbytes(0x10);
        ((t_clone *)s_local)->x_vec = ptVar5;
        ((t_clone *)s_local)->x_vec->c_gl = p_Var4;
        ((t_clone *)s_local)->x_n = 1;
        iVar2 = obj_ninlets(&((t_clone *)s_local)->x_vec->c_gl->gl_obj);
        ((t_clone *)s_local)->x_nin = iVar2;
        ptVar6 = (t_in *)getbytes((long)((t_clone *)s_local)->x_nin * 0x18);
        ((t_clone *)s_local)->x_invec = ptVar6;
        for (outvec._4_4_ = 0; outvec._4_4_ < ((t_clone *)s_local)->x_nin;
            outvec._4_4_ = outvec._4_4_ + 1) {
          ((t_clone *)s_local)->x_invec[outvec._4_4_].i_pd = clone_in_class;
          ((t_clone *)s_local)->x_invec[outvec._4_4_].i_owner = (_clone *)s_local;
          iVar2 = obj_issignalinlet(&((t_clone *)s_local)->x_vec->c_gl->gl_obj,outvec._4_4_);
          ((t_clone *)s_local)->x_invec[outvec._4_4_].i_signal = iVar2;
          ((t_clone *)s_local)->x_invec[outvec._4_4_].i_n = outvec._4_4_;
          if (((t_clone *)s_local)->x_invec[outvec._4_4_].i_signal == 0) {
            inlet_new((t_object *)s_local,&((t_clone *)s_local)->x_invec[outvec._4_4_].i_pd,
                      (t_symbol *)0x0,(t_symbol *)0x0);
          }
          else {
            inlet_new((t_object *)s_local,&((t_clone *)s_local)->x_invec[outvec._4_4_].i_pd,
                      &s_signal,&s_signal);
          }
        }
        iVar2 = obj_noutlets(&((t_clone *)s_local)->x_vec->c_gl->gl_obj);
        ((t_clone *)s_local)->x_nout = iVar2;
        pptVar7 = (t_out **)getbytes(8);
        ((t_clone *)s_local)->x_outvec = pptVar7;
        ptVar8 = (t_out *)getbytes((long)((t_clone *)s_local)->x_nout * 0x18);
        *((t_clone *)s_local)->x_outvec = ptVar8;
        for (outvec._4_4_ = 0; outvec._4_4_ < ((t_clone *)s_local)->x_nout;
            outvec._4_4_ = outvec._4_4_ + 1) {
          ptVar8[outvec._4_4_].o_pd = clone_out_class;
          iVar2 = obj_issignaloutlet(&((t_clone *)s_local)->x_vec->c_gl->gl_obj,outvec._4_4_);
          ptVar8[outvec._4_4_].o_signal = iVar2;
          ptVar8[outvec._4_4_].o_n = ((t_clone *)s_local)->x_startvoice;
          s_00 = (t_symbol *)0x0;
          if (ptVar8[outvec._4_4_].o_signal != 0) {
            s_00 = &s_signal;
          }
          p_Var9 = outlet_new((t_object *)s_local,s_00);
          ptVar8[outvec._4_4_].o_outlet = p_Var9;
          obj_connect(&((t_clone *)s_local)->x_vec->c_gl->gl_obj,outvec._4_4_,
                      (t_object *)(ptVar8 + outvec._4_4_),0);
        }
        clone_setn((t_clone *)s_local,(float)i);
        ((t_clone *)s_local)->x_phase = i + -1;
        canvas_resume_dsp(oldstate);
        if (iVar1 < 0) {
          return (t_clone *)s_local;
        }
        if (((t_clone *)s_local)->x_n <= iVar1) {
          return (t_clone *)s_local;
        }
        canvas_vis(((t_clone *)s_local)->x_vec[iVar1].c_gl,1.0);
        return (t_clone *)s_local;
      }
      goto LAB_00155f03;
    }
LAB_00155af4:
    if (1 < argv_local._4_4_) {
      tVar11 = atom_getfloatarg(1,argv_local._4_4_,(t_atom *)x);
      i = (int)tVar11;
      if ((-1 < i) && (*(int *)&(x->x_obj).te_g.g_pd == 2)) {
        ((t_clone *)s_local)->x_s = (t_symbol *)(x->x_obj).te_g.g_next;
        goto LAB_00155b39;
      }
    }
LAB_00155ef1:
    pd_error((void *)0x0,"usage: clone [-s starting-number] <number> <name> [arguments]");
LAB_00155f03:
    freebytes(s_local,0x88);
    canvas_resume_dsp(oldstate);
    s_local = (t_symbol *)0x0;
  }
  return s_local;
}

Assistant:

static void *clone_new(t_symbol *s, int argc, t_atom *argv)
{
    t_clone *x = (t_clone *)pd_new(clone_class);
    t_canvas *c;
    int wantn, dspstate, i, voicetovis = clone_voicetovis;
    t_out *outvec;
    x->x_invec = 0;
    x->x_outvec = 0;
    x->x_startvoice = 0;
    x->x_suppressvoice = 0;
    clone_voicetovis = -1;
    if (argc == 0)
    {
        x->x_vec = 0;
        x->x_n = 0;
        return (x);
    }
    dspstate = canvas_suspend_dsp();
    while (argc > 0 && argv[0].a_type == A_SYMBOL &&
        argv[0].a_w.w_symbol->s_name[0] == '-')
    {
        if (!strcmp(argv[0].a_w.w_symbol->s_name, "-s") && argc > 1 &&
            argv[1].a_type == A_FLOAT)
        {
            x->x_startvoice = argv[1].a_w.w_float;
            argc -= 2; argv += 2;
        }
        else if (!strcmp(argv[0].a_w.w_symbol->s_name, "-x"))
            x->x_suppressvoice = 1, argc--, argv++;
        else goto usage;
    }
    if (argc >= 2 && (wantn = atom_getfloatarg(0, argc, argv)) >= 0
        && argv[1].a_type == A_SYMBOL)
            x->x_s = argv[1].a_w.w_symbol;
    else if (argc >= 2 && (wantn = atom_getfloatarg(1, argc, argv)) >= 0
        && argv[0].a_type == A_SYMBOL)
            x->x_s = argv[0].a_w.w_symbol;
    else goto usage;
        /* store a copy of the argmuents with an extra space (argc+1) for
        supplying an instance number, which we'll bash as we go. */
    x->x_argc = argc - 1;
    x->x_argv = getbytes(x->x_argc * sizeof(*x->x_argv));
    memcpy(x->x_argv, argv+1, x->x_argc * sizeof(*x->x_argv));
    SETFLOAT(x->x_argv, x->x_startvoice);
    if (!(c = clone_makeone(x->x_s, x->x_argc - x->x_suppressvoice,
        x->x_argv + x->x_suppressvoice)))
            goto fail;
    x->x_vec = (t_copy *)getbytes(sizeof(*x->x_vec));
    x->x_vec[0].c_gl = c;
    x->x_n = 1;
    x->x_nin = obj_ninlets(&x->x_vec[0].c_gl->gl_obj);
    x->x_invec = (t_in *)getbytes(x->x_nin * sizeof(*x->x_invec));
    for (i = 0; i < x->x_nin; i++)
    {
        x->x_invec[i].i_pd = clone_in_class;
        x->x_invec[i].i_owner = x;
        x->x_invec[i].i_signal =
            obj_issignalinlet(&x->x_vec[0].c_gl->gl_obj, i);
        x->x_invec[i].i_n = i;
        if (x->x_invec[i].i_signal)
            inlet_new(&x->x_obj, &x->x_invec[i].i_pd,
                &s_signal, &s_signal);
        else inlet_new(&x->x_obj, &x->x_invec[i].i_pd, 0, 0);
    }
    x->x_nout = obj_noutlets(&x->x_vec[0].c_gl->gl_obj);
    x->x_outvec = (t_out **)getbytes(sizeof(*x->x_outvec));
    x->x_outvec[0] = outvec =
        (t_out *)getbytes(x->x_nout * sizeof(*outvec));
    for (i = 0; i < x->x_nout; i++)
    {
        outvec[i].o_pd = clone_out_class;
        outvec[i].o_signal =
            obj_issignaloutlet(&x->x_vec[0].c_gl->gl_obj, i);
        outvec[i].o_n = x->x_startvoice;
        outvec[i].o_outlet =
            outlet_new(&x->x_obj, (outvec[i].o_signal ? &s_signal : 0));
        obj_connect(&x->x_vec[0].c_gl->gl_obj, i,
            (t_object *)(&outvec[i]), 0);
    }
    clone_setn(x, (t_floatarg)(wantn));
    x->x_phase = wantn-1;
    canvas_resume_dsp(dspstate);
    if (voicetovis >= 0 && voicetovis < x->x_n)
        canvas_vis(x->x_vec[voicetovis].c_gl, 1);
    return (x);
usage:
    pd_error(0, "usage: clone [-s starting-number] <number> <name> [arguments]");
fail:
    freebytes(x, sizeof(t_clone));
    canvas_resume_dsp(dspstate);
    return (0);
}